

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

int fe_equal(secp256k1_fe *a,secp256k1_fe *b)

{
  int iVar1;
  secp256k1_fe bn;
  secp256k1_fe an;
  secp256k1_fe local_68;
  secp256k1_fe local_38;
  
  local_38.n[4] = a->n[4];
  local_38.n[0] = a->n[0];
  local_38.n[1] = a->n[1];
  local_38.n[2] = a->n[2];
  local_38.n[3] = a->n[3];
  local_68.n[4] = b->n[4];
  local_68.n[0] = b->n[0];
  local_68.n[1] = b->n[1];
  local_68.n[2] = b->n[2];
  local_68.n[3] = b->n[3];
  secp256k1_fe_impl_normalize_weak(&local_38);
  iVar1 = secp256k1_fe_equal(&local_38,&local_68);
  return iVar1;
}

Assistant:

static int fe_equal(const secp256k1_fe *a, const secp256k1_fe *b) {
    secp256k1_fe an = *a;
    secp256k1_fe bn = *b;
    secp256k1_fe_normalize_weak(&an);
    return secp256k1_fe_equal(&an, &bn);
}